

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O3

void RigidBodyDynamics::CompositeRigidBodyAlgorithm
               (Model *model,VectorNd *Q,MatrixNd *H,bool update_kinematics)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  JointType JVar4;
  pointer pSVar5;
  pointer pSVar6;
  pointer pJVar7;
  CustomJoint *pCVar8;
  pointer pMVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  Scalar SVar27;
  Scalar SVar28;
  Scalar SVar29;
  Scalar SVar30;
  Scalar SVar31;
  undefined8 uVar32;
  uint uVar33;
  ulong uVar34;
  double *pdVar35;
  pointer pMVar36;
  undefined8 *puVar37;
  DenseStorage<double,__1,__1,__1,_0> *pDVar38;
  DenseStorage<double,__1,__1,__1,_0> *pDVar39;
  double *pdVar40;
  DenseStorage<double,__1,__1,__1,_0> *pDVar41;
  Index row_6;
  DenseStorage<double,__1,__1,__1,_0> *pDVar42;
  DenseStorage<double,__1,__1,__1,_0> *pDVar43;
  ulong uVar44;
  long lVar45;
  Index *pIVar46;
  Index col;
  ulong uVar47;
  long lVar48;
  double *pdVar49;
  Index row_3;
  ulong uVar50;
  double dVar51;
  pointer pSVar52;
  bool bVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  MatrixNd H_temp2_2;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  SpatialVector F;
  VectorNd H_temp2;
  Matrix63 F_63;
  undefined1 local_3a1 [9];
  DenseStorage<double,__1,__1,__1,_0> local_398;
  DenseStorage<double,__1,__1,__1,_0> *local_380;
  DenseStorage<double,__1,__1,__1,_0> local_378;
  DenseStorage<double,__1,__1,__1,_0> *local_358;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_350;
  DenseStorage<double,__1,__1,__1,_0> local_340;
  double local_328;
  Model *local_320;
  SpatialMatrix local_318;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_1f8;
  double local_1d8 [5];
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  DenseStorage<double,__1,__1,__1,_0> *local_168 [2];
  double adStack_158 [2];
  DenseStorage<double,__1,__1,__1,_0> local_148;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_130;
  double local_128 [5];
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  DenseStorage<double,__1,__1,__1,_0> *local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  uVar34 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  local_340.m_cols = (Index)H;
  if (1 < uVar34) {
    uVar50 = 1;
    do {
      if (update_kinematics) {
        jcalc_X_lambda_S(model,(uint)uVar50,Q);
      }
      pSVar5 = (model->I).
               super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar6 = (model->Ic).
               super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar6[uVar50].m = pSVar5[uVar50].m;
      dVar51 = *(double *)((long)&pSVar5[uVar50].h.super_Vector3d + 8);
      *(undefined8 *)&pSVar6[uVar50].h.super_Vector3d =
           *(undefined8 *)&pSVar5[uVar50].h.super_Vector3d;
      *(double *)((long)&pSVar6[uVar50].h.super_Vector3d + 8) = dVar51;
      *(double *)((long)&pSVar6[uVar50].h.super_Vector3d + 0x10) =
           *(double *)((long)&pSVar5[uVar50].h.super_Vector3d + 0x10);
      SVar27 = pSVar5[uVar50].Ixx;
      SVar28 = (&pSVar5[uVar50].Ixx)[1];
      SVar29 = pSVar5[uVar50].Iyy;
      SVar30 = (&pSVar5[uVar50].Iyy)[1];
      SVar31 = (&pSVar5[uVar50].Izy)[1];
      pSVar6[uVar50].Izy = pSVar5[uVar50].Izy;
      (&pSVar6[uVar50].Izy)[1] = SVar31;
      pSVar6[uVar50].Iyy = SVar29;
      (&pSVar6[uVar50].Iyy)[1] = SVar30;
      pSVar6[uVar50].Ixx = SVar27;
      (&pSVar6[uVar50].Ixx)[1] = SVar28;
      uVar50 = (ulong)((uint)uVar50 + 1);
      uVar34 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    } while (uVar50 <= uVar34 && uVar34 - uVar50 != 0);
  }
  uVar33 = (int)uVar34 - 1;
  if (uVar33 != 0) {
    pDVar43 = (DenseStorage<double,__1,__1,__1,_0> *)(ulong)uVar33;
    adStack_158[1] = (double)((long)pDVar43 * 0x90 + 0x28);
    pDVar42 = (DenseStorage<double,__1,__1,__1,_0> *)local_340.m_cols;
    local_320 = model;
    do {
      uVar34 = (ulong)(model->lambda).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)pDVar43];
      if (uVar34 != 0) {
        pSVar5 = (model->Ic).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        Math::SpatialTransform::applyTranspose
                  ((SpatialRigidBodyInertia *)&local_318,
                   (model->X_lambda).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)pDVar43,pSVar5 + (long)pDVar43)
        ;
        dVar54 = *(double *)&pSVar5[uVar34].h.super_Vector3d;
        dVar2 = *(double *)((long)&pSVar5[uVar34].h.super_Vector3d + 8);
        dVar51 = pSVar5[uVar34].Izz;
        uVar33 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[(long)pDVar43];
        pSVar6 = (model->Ic).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar35 = (double *)((long)&pSVar5[uVar34].h.super_Vector3d + 0x10);
        dVar3 = *pdVar35;
        dVar55 = pdVar35[1];
        pSVar6[uVar33].m =
             pSVar5[uVar34].m +
             local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0];
        dVar56 = pSVar5[uVar34].Iyx;
        dVar57 = (&pSVar5[uVar34].Iyx)[1];
        dVar12 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [7] + pSVar5[uVar34].Izx;
        dVar13 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [8] + (&pSVar5[uVar34].Izx)[1];
        *(double *)&pSVar6[uVar33].h.super_Vector3d =
             local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
             + dVar54;
        *(double *)((long)&pSVar6[uVar33].h.super_Vector3d + 8) =
             local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2]
             + dVar2;
        pdVar35 = (double *)((long)&pSVar6[uVar33].h.super_Vector3d + 0x10);
        *pdVar35 = dVar3 + local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[3];
        pdVar35[1] = dVar55 + local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[4];
        pSVar6[uVar33].Iyx =
             local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5]
             + dVar56;
        (&pSVar6[uVar33].Iyx)[1] =
             local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6]
             + dVar57;
        auVar10._8_4_ = SUB84(dVar13,0);
        auVar10._0_8_ = dVar12;
        auVar10._12_4_ = (int)((ulong)dVar13 >> 0x20);
        pSVar6[uVar33].Izx = dVar12;
        pSVar6[uVar33].Izy = (Scalar)auVar10._8_8_;
        pSVar6[uVar33].Izz =
             dVar51 + local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[9];
        pDVar42 = (DenseStorage<double,__1,__1,__1,_0> *)local_340.m_cols;
      }
      pJVar7 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_3a1._1_8_ = ZEXT48(pJVar7[(long)pDVar43].q_index);
      JVar4 = pJVar7[(long)pDVar43].mJointType;
      pDVar41 = pDVar43;
      if (pJVar7[(long)pDVar43].mDoFCount == 3) {
        if (JVar4 == JointTypeCustom) goto LAB_001716fd;
        Math::SpatialRigidBodyInertia::toMatrix
                  ((model->Ic).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)pDVar43);
        pMVar9 = (model->multdof3_S).
                 super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pMVar36 = pMVar9 + (long)pDVar43;
        local_358 = (DenseStorage<double,__1,__1,__1,_0> *)
                    local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[0];
        pDStack_350 = (DenseStorage<double,__1,__1,__1,_0> *)
                      local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[1];
        local_168[0] = (DenseStorage<double,__1,__1,__1,_0> *)
                       local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[2];
        local_168[1] = (DenseStorage<double,__1,__1,__1,_0> *)
                       local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[3];
        local_a8 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[4];
        dStack_a0 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[5];
        local_b8 = (DenseStorage<double,__1,__1,__1,_0> *)
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[6];
        dStack_b0 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[7];
        lVar48 = 0;
        do {
          dVar51 = *(double *)
                    ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar48 + (long)adStack_158[1] + -0x28);
          dVar12 = *(double *)
                    ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar48 + (long)adStack_158[1] + -0x20);
          dVar55 = dVar12 * dStack_b0;
          dVar13 = *(double *)
                    ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar48 + (long)adStack_158[1] + -0x18);
          dVar54 = *(double *)
                    ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar48 + (long)adStack_158[1] + -0x10);
          dVar2 = *(double *)
                   ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar48 + (long)adStack_158[1] + -8);
          dVar3 = *(double *)
                   ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar48 + (long)adStack_158[1]);
          *(double *)((long)&local_148.m_data + lVar48) =
               dVar3 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x1e] +
               dVar2 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x18] +
               dVar54 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x12] +
               dVar13 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0xc] +
               dVar12 * (double)local_b8 +
               dVar51 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0];
          *(double *)((long)&local_148.m_rows + lVar48) =
               dVar3 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x1f] +
               dVar2 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x19] +
               dVar54 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x13] +
               dVar13 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0xd] +
               dVar55 + dVar51 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[1];
          dVar51 = *(double *)
                    ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar48 + (long)adStack_158[1] + -0x28);
          dVar12 = *(double *)
                    ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar48 + (long)adStack_158[1] + -0x20);
          dVar13 = *(double *)
                    ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar48 + (long)adStack_158[1] + -0x18);
          dVar54 = *(double *)
                    ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar48 + (long)adStack_158[1] + -0x10);
          dVar2 = *(double *)
                   ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar48 + (long)adStack_158[1] + -8);
          dVar3 = *(double *)
                   ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar48 + (long)adStack_158[1]);
          *(double *)((long)&local_148.m_cols + lVar48) =
               dVar3 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x20] +
               dVar2 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x1a] +
               dVar54 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x14] +
               dVar13 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0xe] +
               dVar12 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[8] +
               dVar51 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[2];
          *(double *)((long)&pDStack_130 + lVar48) =
               dVar3 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x21] +
               dVar2 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x1b] +
               dVar54 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x15] +
               dVar13 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0xf] +
               dVar12 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[9] +
               dVar51 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[3];
          dVar51 = *(double *)
                    ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar48 + (long)adStack_158[1] + -0x28);
          dVar12 = *(double *)
                    ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar48 + (long)adStack_158[1] + -0x20);
          dVar55 = dVar51 * dStack_a0;
          dVar13 = *(double *)
                    ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar48 + (long)adStack_158[1] + -0x18);
          dVar54 = *(double *)
                    ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                            m_storage + lVar48 + (long)adStack_158[1] + -0x10);
          dVar2 = *(double *)
                   ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar48 + (long)adStack_158[1] + -8);
          dVar3 = *(double *)
                   ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar48 + (long)adStack_158[1]);
          *(double *)((long)local_128 + lVar48) =
               dVar3 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x22] +
               dVar2 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x1c] +
               dVar54 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x16] +
               dVar13 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x10] +
               dVar12 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[10] + dVar51 * local_a8;
          *(double *)((long)local_128 + lVar48 + 8) =
               dVar3 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x23] +
               dVar2 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x1d] +
               dVar54 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x17] +
               dVar13 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x11] +
               dVar12 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0xb] + dVar55;
          lVar48 = lVar48 + 0x30;
        } while (lVar48 != 0x90);
        pdVar35 = pDVar42->m_data;
        lVar48 = pDVar42->m_rows;
        dVar51 = *(double *)
                  &(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).m_storage
        ;
        dVar12 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 8);
        dVar13 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x10);
        dVar54 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x18);
        dVar2 = *(double *)
                 ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                         m_storage + 0x20);
        dVar3 = *(double *)
                 ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                         m_storage + 0x28);
        dVar55 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x30);
        dVar56 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x38);
        dVar57 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x40);
        dVar58 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x48);
        dVar59 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x50);
        dVar14 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x58);
        dVar15 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x60);
        dVar16 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x68);
        dVar17 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x70);
        dVar18 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x78);
        dVar19 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x80);
        dVar20 = *(double *)
                  ((long)&(pMVar36->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                          m_storage + 0x88);
        lVar45 = 0x10;
        do {
          dVar21 = *(double *)((long)local_168 + lVar45 * 2);
          dVar22 = *(double *)((long)adStack_158 + lVar45 * 2 + -8);
          dVar23 = *(double *)((long)adStack_158 + lVar45 * 2);
          dVar24 = *(double *)((long)adStack_158 + lVar45 * 2 + 8);
          dVar25 = *(double *)((long)&local_148.m_data + lVar45 * 2);
          dVar26 = *(double *)((long)&local_148.m_rows + lVar45 * 2);
          *(double *)((long)&local_328 + lVar45) =
               dVar3 * dVar26 + dVar54 * dVar24 + dVar12 * dVar22 +
               dVar2 * dVar25 + dVar13 * dVar23 + dVar51 * dVar21;
          *(double *)((long)&local_320 + lVar45) =
               dVar14 * dVar26 + dVar58 * dVar24 + dVar56 * dVar22 +
               dVar59 * dVar25 + dVar57 * dVar23 + dVar55 * dVar21;
          *(double *)
           ((long)local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array + lVar45) =
               dVar26 * dVar20 + dVar24 * dVar18 + dVar22 * dVar16 +
               dVar25 * dVar19 + dVar23 * dVar17 + dVar21 * dVar15;
          lVar45 = lVar45 + 0x18;
        } while (lVar45 != 0x58);
        puVar37 = (undefined8 *)((long)pdVar35 + (lVar48 * 8 + 8) * local_3a1._1_8_ + 0x10);
        lVar45 = 0x10;
        do {
          uVar32 = *(undefined8 *)((long)&local_320 + lVar45);
          puVar37[-2] = *(undefined8 *)((long)&local_328 + lVar45);
          puVar37[-1] = uVar32;
          *puVar37 = *(undefined8 *)
                      ((long)local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar45);
          lVar45 = lVar45 + 0x18;
          puVar37 = puVar37 + lVar48;
        } while (lVar45 != 0x58);
        local_380 = pDVar43;
        if ((model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[(long)pDVar43] != 0) {
          local_328 = (double)(local_3a1._1_8_ * 8);
          do {
            Math::SpatialTransform::toMatrixTranspose
                      (&local_318,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)pDVar43);
            local_358 = (DenseStorage<double,__1,__1,__1,_0> *)
                        local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0];
            pDStack_350 = (DenseStorage<double,__1,__1,__1,_0> *)
                          local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[1];
            local_168[0] = (DenseStorage<double,__1,__1,__1,_0> *)
                           local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[2];
            local_168[1] = (DenseStorage<double,__1,__1,__1,_0> *)
                           local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[3];
            local_a8 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[4];
            dStack_a0 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[5];
            local_b8 = (DenseStorage<double,__1,__1,__1,_0> *)
                       local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[6];
            dStack_b0 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[7];
            local_48 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0xc];
            dStack_40 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0xd];
            local_58 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x12];
            dStack_50 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x13];
            local_68 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x18];
            dStack_60 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x19];
            local_78 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x1e];
            dStack_70 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x1f];
            local_88 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[8];
            dStack_80 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[9];
            local_98 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0xe];
            dStack_90 = local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0xf];
            lVar48 = 0;
            do {
              dVar51 = *(double *)((long)&local_148.m_data + lVar48);
              dVar12 = *(double *)((long)&local_148.m_rows + lVar48);
              dVar13 = *(double *)((long)&local_148.m_cols + lVar48);
              dVar54 = *(double *)((long)&pDStack_130 + lVar48);
              dVar56 = dStack_b0 * dVar12;
              dVar55 = dStack_40 * dVar13;
              dVar57 = dStack_50 * dVar54;
              dVar2 = *(double *)((long)local_128 + lVar48);
              dVar58 = dStack_60 * dVar2;
              dVar3 = *(double *)((long)local_128 + lVar48 + 8);
              dVar59 = dStack_70 * dVar3;
              *(double *)((long)&local_1f8.m_dst + lVar48) =
                   local_78 * dVar3 +
                   local_68 * dVar2 +
                   local_58 * dVar54 +
                   local_48 * dVar13 +
                   (double)local_b8 * dVar12 +
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0] * dVar51;
              *(double *)((long)local_1d8 + lVar48 + -0x18) =
                   dVar59 + dVar58 + dVar57 + dVar55 + dVar56 + local_318.
                                                                super_Matrix<double,_6,_6,_0,_6,_6>.
                                                                                                                                
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                                  .m_storage.m_data.array[1] * dVar51;
              dVar55 = (double)local_168[1] * dVar51;
              dVar57 = dStack_80 * dVar12;
              dVar56 = dStack_90 * dVar13;
              *(double *)((long)local_1d8 + lVar48 + -0x10) =
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x20] * dVar3 +
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1a] * dVar2 +
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x14] * dVar54 +
                   local_98 * dVar13 + local_88 * dVar12 + (double)local_168[0] * dVar51;
              *(double *)((long)local_1d8 + lVar48 + -8) =
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x21] * dVar3 +
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1b] * dVar2 +
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x15] * dVar54 + dVar56 + dVar57 + dVar55;
              dVar55 = dVar51 * dStack_a0;
              *(double *)((long)local_1d8 + lVar48) =
                   dVar3 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0x22] +
                   dVar2 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0x1c] +
                   dVar54 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[0x16] +
                   dVar13 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[0x10] +
                   dVar12 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[10] + dVar51 * local_a8;
              *(double *)((long)local_1d8 + lVar48 + 8) =
                   dVar3 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0x23] +
                   dVar2 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0x1d] +
                   dVar54 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[0x17] +
                   dVar13 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[0x11] +
                   dVar12 * local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[0xb] + dVar55;
              lVar48 = lVar48 + 0x30;
            } while (lVar48 != 0x90);
            local_148.m_data = (double *)local_1f8.m_dst;
            local_148.m_rows = (Index)local_1f8.m_src;
            local_148.m_cols = (Index)local_1f8.m_functor;
            pDStack_130 = (DenseStorage<double,__1,__1,__1,_0> *)local_1f8.m_dstExpr;
            local_128[0] = local_1d8[0];
            local_128[1] = local_1d8[1];
            local_128[2] = local_1d8[2];
            local_128[3] = local_1d8[3];
            local_128[4] = local_1d8[4];
            dStack_100 = dStack_1b0;
            local_f8 = local_1a8;
            dStack_f0 = dStack_1a0;
            local_e8 = local_198;
            dStack_e0 = dStack_190;
            local_d8 = local_188;
            dStack_d0 = dStack_180;
            local_c8 = local_178;
            dStack_c0 = dStack_170;
            pJVar7 = (model->mJoints).
                     super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pDVar43 = (DenseStorage<double,__1,__1,__1,_0> *)
                      (ulong)(model->lambda).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[(long)pDVar43];
            dVar51 = (double)(ulong)pJVar7[(long)pDVar43].q_index;
            if (pJVar7[(long)pDVar43].mJointType == JointTypeCustom) {
              pCVar8 = (model->mCustomJoints).
                       super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [pJVar7[(long)pDVar43].custom_joint_index];
              uVar33 = *(uint *)(pCVar8 + 8);
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
                   = (double)(pCVar8 + 0x70);
              local_358 = pDVar43;
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0]
                   = (double)&local_148;
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
              PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_3a1 + 9),
                         (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                          *)&local_318);
              uVar32 = local_3a1._1_8_;
              local_378.m_cols = pDVar42->m_rows;
              local_378.m_data =
                   (double *)
                   ((long)pDVar42->m_data + (long)dVar51 * local_378.m_cols * 8 + (long)local_328);
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
                   = 1.48219693752374e-323;
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4]
                   = (double)local_3a1._1_8_;
              local_340.m_data = local_398.m_data;
              local_340.m_rows = local_398.m_rows;
              local_1f8.m_dst = (DstEvaluatorType *)&local_378;
              local_1f8.m_src = (SrcEvaluatorType *)&local_340;
              local_1f8.m_functor = (assign_op<double,_double> *)local_3a1;
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0]
                   = (double)local_378.m_data;
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2]
                   = (double)(ulong)uVar33;
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3]
                   = (double)pDVar42;
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5]
                   = dVar51;
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6]
                   = (double)local_378.m_cols;
              local_1f8.m_dstExpr = (DstXprType *)&local_318;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run(&local_1f8);
              lVar48 = pDVar42->m_rows;
              pdVar35 = pDVar42->m_data + (long)dVar51 + lVar48 * uVar32;
              lVar45 = 0;
              pdVar40 = local_398.m_data;
              do {
                if (uVar33 != 0) {
                  pDVar43 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                  pdVar49 = pdVar40;
                  do {
                    pdVar35[(long)pDVar43] = *pdVar49;
                    pDVar43 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar43->m_data + 1);
                    pdVar49 = pdVar49 + local_398.m_rows;
                  } while ((DenseStorage<double,__1,__1,__1,_0> *)(ulong)uVar33 != pDVar43);
                }
                lVar45 = lVar45 + 1;
                pdVar40 = pdVar40 + 1;
                pdVar35 = pdVar35 + lVar48;
              } while (lVar45 != 3);
              free(local_398.m_data);
              pDVar43 = local_358;
            }
            else if (pJVar7[(long)pDVar43].mDoFCount == 3) {
              local_1f8.m_src =
                   (SrcEvaluatorType *)
                   ((model->multdof3_S).
                    super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    .
                    super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pDVar43);
              local_1f8.m_dst = (DstEvaluatorType *)&local_148;
              Matrix3_t::
              Matrix3_t<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,3,0,6,3>,0>>
                        ((Matrix3_t *)&local_318,
                         (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
                          *)&local_1f8);
              lVar48 = pDVar42->m_rows;
              puVar37 = (undefined8 *)
                        ((long)pDVar42->m_data + lVar48 * 8 * (long)dVar51 + (long)local_328 + 0x10)
              ;
              lVar45 = 0x10;
              do {
                uVar32 = *(undefined8 *)((long)&local_320 + lVar45);
                puVar37[-2] = *(undefined8 *)((long)&local_328 + lVar45);
                puVar37[-1] = uVar32;
                *puVar37 = *(undefined8 *)
                            ((long)local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array + lVar45);
                lVar45 = lVar45 + 0x18;
                puVar37 = puVar37 + lVar48;
              } while (lVar45 != 0x58);
              pdVar35 = pDVar42->m_data;
              lVar48 = pDVar42->m_rows;
              lVar45 = lVar48 * local_3a1._1_8_;
              pdVar35[(long)dVar51 + lVar45] =
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0];
              pdVar35[(long)dVar51 + lVar45 + 1] =
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[3];
              pdVar35[(long)dVar51 + lVar45 + 2] =
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[6];
              pdVar35[(long)dVar51 + lVar45 + lVar48] =
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[1];
              pdVar35[(long)dVar51 + lVar45 + lVar48 + 1] =
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[4];
              pdVar35[(long)dVar51 + lVar45 + lVar48 + 2] =
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[7];
              pdVar35[(long)dVar51 + lVar45 + lVar48 * 2] =
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[2];
              pdVar35[(long)dVar51 + lVar45 + lVar48 * 2 + 1] =
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[5];
              pdVar35[(long)dVar51 + lVar45 + lVar48 * 2 + 2] =
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[8];
            }
            else if (pJVar7[(long)pDVar43].mDoFCount == 1) {
              pSVar52 = (model->S).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              dVar54 = *(double *)
                        &pSVar52[(long)pDVar43].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
              dVar2 = *(double *)
                       ((long)&pSVar52[(long)pDVar43].super_Matrix<double,_6,_1,_0,_6,_1>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
              pdVar35 = (double *)
                        ((long)&pSVar52[(long)pDVar43].super_Matrix<double,_6,_1,_0,_6,_1>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10)
              ;
              dVar3 = *pdVar35;
              dVar55 = pdVar35[1];
              pdVar35 = (double *)
                        ((long)&pSVar52[(long)pDVar43].super_Matrix<double,_6,_1,_0,_6,_1>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20)
              ;
              dVar56 = *pdVar35;
              dVar57 = pdVar35[1];
              dVar12 = local_1d8[1] * dVar57 + (double)local_1f8.m_dstExpr * dVar55 +
                       (double)local_1f8.m_src * dVar2 +
                       local_1d8[0] * dVar56 + (double)local_1f8.m_functor * dVar3 +
                       (double)local_1f8.m_dst * dVar54;
              dVar13 = dStack_1a0 * dVar57 + dStack_1b0 * dVar55 + local_1d8[3] * dVar2 +
                       local_1a8 * dVar56 + local_1d8[4] * dVar3 + local_1d8[2] * dVar54;
              dVar54 = dStack_170 * dVar57 + dStack_180 * dVar55 + dStack_190 * dVar2 +
                       local_178 * dVar56 + local_188 * dVar3 + local_198 * dVar54;
              pdVar35 = pDVar42->m_data;
              lVar48 = pDVar42->m_rows * (long)dVar51;
              auVar11._8_4_ = SUB84(dVar13,0);
              auVar11._0_8_ = dVar12;
              auVar11._12_4_ = (int)((ulong)dVar13 >> 0x20);
              *(undefined1 (*) [16])((long)pdVar35 + lVar48 * 8 + (long)local_328) = auVar11;
              *(double *)((long)pdVar35 + lVar48 * 8 + (long)local_328 + 0x10) = dVar54;
              pdVar35 = pDVar42->m_data;
              lVar48 = pDVar42->m_rows;
              lVar45 = lVar48 * local_3a1._1_8_;
              pdVar35[(long)dVar51 + lVar45] = dVar12;
              pdVar35[(long)dVar51 + lVar45 + lVar48] = dVar13;
              pdVar35[(long)dVar51 + lVar45 + lVar48 * 2] = dVar54;
            }
            pDVar41 = local_380;
          } while ((model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pDVar43] != 0);
        }
      }
      else if (pJVar7[(long)pDVar43].mDoFCount == 1) {
        if (JVar4 == JointTypeCustom) {
LAB_001716fd:
          uVar34 = (ulong)pJVar7[(long)pDVar43].custom_joint_index;
          local_168[0] = (DenseStorage<double,__1,__1,__1,_0> *)
                         (ulong)*(uint *)((model->mCustomJoints).
                                          super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar34] + 8);
          Math::SpatialRigidBodyInertia::toMatrix
                    ((model->Ic).
                     super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)pDVar43);
          pCVar8 = (model->mCustomJoints).
                   super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar34];
          local_1f8.m_src = (SrcEvaluatorType *)(pCVar8 + 0x70);
          local_378.m_data = (double *)0x0;
          local_378.m_rows = 0;
          local_378.m_cols = 0;
          lVar48 = *(long *)(pCVar8 + 0x80);
          local_358 = (DenseStorage<double,__1,__1,__1,_0> *)uVar34;
          local_1f8.m_dst = (DstEvaluatorType *)&local_318;
          if ((lVar48 != 0) &&
             (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar48),0) < 6)) {
            puVar37 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar37 = operator_new;
            __cxa_throw(puVar37,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_378,lVar48 * 6,6,lVar48);
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_378,(SrcXprType *)&local_1f8,
                (assign_op<double,_double> *)&local_148);
          local_1f8.m_dst =
               (DstEvaluatorType *)
               ((model->mCustomJoints).
                super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)local_358] + 0x70);
          local_358 = (DenseStorage<double,__1,__1,__1,_0> *)(local_3a1._1_8_ * 8);
          local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
               (double)pDVar42->m_rows;
          local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               (double)((long)(((Matrix<double,_6,_1,_0,_6,_1> *)&local_358->m_data)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array +
                       (long)(pDVar42->m_data +
                             (long)local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[6] * local_3a1._1_8_));
          local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               (double)local_168[0];
          local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               (double)local_168[0];
          local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
               (double)local_3a1._1_8_;
          local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] =
               (double)local_3a1._1_8_;
          local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
               (double)pDVar42;
          local_1f8.m_src = (SrcEvaluatorType *)&local_378;
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_318,
                     (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                      *)&local_1f8,(assign_op<double,_double> *)&local_148,(type)0x0);
          uVar33 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pDVar43];
          local_380 = pDVar43;
          while (uVar33 != 0) {
            Math::SpatialTransform::toMatrixTranspose
                      (&local_318,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)pDVar43);
            local_1f8.m_src = (SrcEvaluatorType *)&local_378;
            local_1f8.m_dst = (DstEvaluatorType *)&local_318;
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_1f8.m_src,
                       (Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                        *)&local_1f8,(assign_op<double,_double> *)&local_148,(type)0x0);
            pJVar7 = (model->mJoints).
                     super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pDVar43 = (DenseStorage<double,__1,__1,__1,_0> *)
                      (ulong)(model->lambda).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[(long)pDVar43];
            dVar51 = (double)(ulong)pJVar7[(long)pDVar43].q_index;
            if (pJVar7[(long)pDVar43].mJointType == JointTypeCustom) {
              pCVar8 = (model->mCustomJoints).
                       super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [pJVar7[(long)pDVar43].custom_joint_index];
              uVar33 = *(uint *)(pCVar8 + 8);
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
                   = (double)(pCVar8 + 0x70);
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0]
                   = (double)&local_378;
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
              PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_3a1 + 9),
                         (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                          *)&local_318);
              uVar32 = local_3a1._1_8_;
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6]
                   = (double)pDVar42->m_rows;
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0]
                   = (double)((long)(((Matrix<double,_6,_1,_0,_6,_1> *)&local_358->m_data)->
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                                    m_storage.m_data.array +
                             (long)(pDVar42->m_data +
                                   (long)dVar51 *
                                   (long)local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                         .m_storage.m_data.array[6]));
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
                   = 1.48219693752374e-323;
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4]
                   = (double)local_3a1._1_8_;
              local_340.m_data = local_398.m_data;
              local_340.m_rows = local_398.m_rows;
              local_1f8.m_dst = (DstEvaluatorType *)&local_148;
              local_1f8.m_src = (SrcEvaluatorType *)&local_340;
              local_1f8.m_functor = (assign_op<double,_double> *)local_3a1;
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2]
                   = (double)(ulong)uVar33;
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3]
                   = (double)pDVar42;
              local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5]
                   = dVar51;
              local_1f8.m_dstExpr = (DstXprType *)&local_318;
              local_148.m_data =
                   (double *)
                   local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0];
              local_148.m_cols =
                   (Index)local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[6];
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run(&local_1f8);
              lVar48 = pDVar42->m_rows;
              pdVar35 = pDVar42->m_data + (long)dVar51 + lVar48 * uVar32;
              lVar45 = 0;
              pdVar40 = local_398.m_data;
              do {
                if (uVar33 != 0) {
                  pDVar41 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                  pdVar49 = pdVar40;
                  do {
                    pdVar35[(long)pDVar41] = *pdVar49;
                    pDVar41 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar41->m_data + 1);
                    pdVar49 = pdVar49 + local_398.m_rows;
                  } while ((DenseStorage<double,__1,__1,__1,_0> *)(ulong)uVar33 != pDVar41);
                }
                lVar45 = lVar45 + 1;
                pdVar40 = pdVar40 + 1;
                pdVar35 = pdVar35 + lVar48;
              } while (lVar45 != 3);
              free(local_398.m_data);
            }
            else {
              if (pJVar7[(long)pDVar43].mDoFCount == 3) {
                pMVar9 = (local_320->multdof3_S).
                         super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                         .
                         super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_398.m_data = (double *)0x0;
                local_398.m_rows = 0;
                local_398.m_cols = 0;
                if (0x2aaaaaaaaaaaaaaa < local_378.m_cols) {
LAB_00172000:
                  puVar37 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar37 = operator_new;
                  __cxa_throw(puVar37,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                }
                Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                          ((DenseStorage<double,__1,__1,__1,_0> *)(local_3a1 + 9),
                           local_378.m_cols * 3,local_378.m_cols,3);
                if ((local_398.m_rows != local_378.m_cols) ||
                   (bVar53 = true, pDVar41 = (DenseStorage<double,__1,__1,__1,_0> *)local_378.m_cols
                   , (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols !=
                     (DenseStorage<double,__1,__1,__1,_0> *)0x3)) {
                  if (0x2aaaaaaaaaaaaaaa < local_378.m_cols) goto LAB_00172000;
                  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                            ((DenseStorage<double,__1,__1,__1,_0> *)(local_3a1 + 9),
                             local_378.m_cols * 3,local_378.m_cols,3);
                  bVar53 = (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols ==
                           (DenseStorage<double,__1,__1,__1,_0> *)0x3;
                  pDVar41 = (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_rows;
                }
                if ((pDVar41 == (DenseStorage<double,__1,__1,__1,_0> *)local_378.m_cols) &&
                   (pDVar39 = (DenseStorage<double,__1,__1,__1,_0> *)0x3, bVar53)) {
LAB_00171dcc:
                  pDVar38 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                  pdVar35 = local_398.m_data;
                  do {
                    if (0 < (long)pDVar41) {
                      lVar48 = (long)pDVar38 * 0x30;
                      pDVar42 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                      pIVar46 = &((DenseStorage<double,__1,__1,__1,_0> *)
                                 ((long)local_378.m_data + 0x18))->m_rows;
                      do {
                        pdVar1 = (double *)
                                 ((long)&pMVar9[(long)pDVar43].
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                         .m_storage + lVar48);
                        pdVar40 = (double *)
                                  ((long)&pMVar9[(long)pDVar43].
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                          .m_storage + lVar48 + 0x10);
                        pdVar49 = (double *)
                                  ((long)&pMVar9[(long)pDVar43].
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                          .m_storage + lVar48 + 0x20);
                        pdVar35[(long)pDVar42] =
                             pdVar49[1] * (double)pIVar46[1] +
                             pdVar40[1] *
                             (double)((DenseStorage<double,__1,__1,__1,_0> *)(pIVar46 + -1))->m_data
                             + pdVar1[1] * (double)pIVar46[-3] +
                             *pdVar49 * (double)*pIVar46 +
                             *pdVar40 * (double)pIVar46[-2] +
                             *pdVar1 * ((plain_array<double,_6,_0,_16> *)(pIVar46 + -4))->array[0];
                        pDVar42 = (DenseStorage<double,__1,__1,__1,_0> *)
                                  ((long)&pDVar42->m_data + 1);
                        pIVar46 = pIVar46 + local_378.m_rows;
                      } while (pDVar41 != pDVar42);
                    }
                    pDVar38 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar38->m_data + 1);
                    pdVar35 = pdVar35 + (long)pDVar41;
                    pDVar42 = (DenseStorage<double,__1,__1,__1,_0> *)local_340.m_cols;
                  } while (pDVar38 != pDVar39);
                }
                else {
                  if (0x2aaaaaaaaaaaaaaa < local_378.m_cols) goto LAB_00172000;
                  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                            ((DenseStorage<double,__1,__1,__1,_0> *)(local_3a1 + 9),
                             local_378.m_cols * 3,local_378.m_cols,3);
                  pDVar39 = (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols;
                  pDVar41 = (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_rows;
                  if (0 < local_398.m_cols) goto LAB_00171dcc;
                }
                uVar32 = local_3a1._1_8_;
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [6] = (double)pDVar42->m_rows;
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [0] = (double)((long)(((Matrix<double,_6,_1,_0,_6,_1> *)&local_358->m_data)->
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                                     m_storage.m_data.array +
                              (long)(pDVar42->m_data +
                                    (long)local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                          .m_storage.m_data.array[6] * (long)dVar51));
                local_1f8.m_dstExpr = (DstXprType *)&local_318;
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [2] = (double)local_398.m_cols;
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [4] = (double)local_3a1._1_8_;
                local_340.m_data = local_398.m_data;
                local_1f8.m_dst = (DstEvaluatorType *)&local_148;
                local_1f8.m_src = (SrcEvaluatorType *)&local_340;
                local_1f8.m_functor = (assign_op<double,_double> *)local_3a1;
                local_340.m_rows = (Index)pDVar41;
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [1] = (double)pDVar41;
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [3] = (double)pDVar42;
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [5] = dVar51;
                local_148.m_data =
                     (double *)
                     local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0];
                local_148.m_cols =
                     (Index)local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[6];
                Eigen::internal::
                dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                ::run(&local_1f8);
                if (0 < local_398.m_rows) {
                  lVar48 = pDVar42->m_rows;
                  pdVar35 = pDVar42->m_data + (long)dVar51 + lVar48 * uVar32;
                  pDVar41 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                  pdVar40 = local_398.m_data;
                  do {
                    if (0 < local_398.m_cols) {
                      pDVar39 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                      pdVar49 = pdVar40;
                      do {
                        pdVar35[(long)pDVar39] = *pdVar49;
                        pDVar39 = (DenseStorage<double,__1,__1,__1,_0> *)
                                  ((long)&pDVar39->m_data + 1);
                        pdVar49 = pdVar49 + local_398.m_rows;
                      } while ((DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols != pDVar39);
                    }
                    pDVar41 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar41->m_data + 1);
                    pdVar40 = pdVar40 + 1;
                    pdVar35 = pdVar35 + lVar48;
                  } while (pDVar41 != (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_rows);
                }
              }
              else {
                if (pJVar7[(long)pDVar43].mDoFCount != 1) goto LAB_00171f9f;
                pSVar52 = (local_320->S).
                          super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)pDVar43;
                local_398.m_data = (double *)0x0;
                local_398.m_rows = 0;
                local_398.m_cols = 0;
                Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                          ((DenseStorage<double,__1,__1,__1,_0> *)(local_3a1 + 9),local_378.m_cols,
                           local_378.m_cols,1);
                if ((local_398.m_rows == local_378.m_cols) &&
                   ((DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols ==
                    (DenseStorage<double,__1,__1,__1,_0> *)0x1)) {
                  bVar53 = true;
                  pDVar41 = (DenseStorage<double,__1,__1,__1,_0> *)local_378.m_cols;
                  pDVar39 = (DenseStorage<double,__1,__1,__1,_0> *)0x1;
                }
                else {
                  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                            ((DenseStorage<double,__1,__1,__1,_0> *)(local_3a1 + 9),local_378.m_cols
                             ,local_378.m_cols,1);
                  bVar53 = (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols ==
                           (DenseStorage<double,__1,__1,__1,_0> *)0x1;
                  pDVar41 = (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_rows;
                  pDVar39 = (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols;
                }
                pDVar38 = (DenseStorage<double,__1,__1,__1,_0> *)0x1;
                if (!(bool)(pDVar41 == (DenseStorage<double,__1,__1,__1,_0> *)local_378.m_cols &
                           bVar53)) {
                  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                            ((DenseStorage<double,__1,__1,__1,_0> *)(local_3a1 + 9),local_378.m_cols
                             ,local_378.m_cols,1);
                  pDVar38 = (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols;
                  pDVar41 = (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_rows;
                  pDVar39 = (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols;
                }
                uVar32 = local_3a1._1_8_;
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [2] = (double)pDVar39;
                if (0 < (long)pDVar38 * (long)pDVar41) {
                  pIVar46 = &((DenseStorage<double,__1,__1,__1,_0> *)((long)local_378.m_data + 0x18)
                             )->m_rows;
                  lVar48 = 0;
                  do {
                    local_398.m_data[lVar48] =
                         *(double *)
                          ((long)&(pSVar52->super_Matrix<double,_6,_1,_0,_6,_1>).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                          0x28) * (double)pIVar46[1] +
                         *(double *)
                          ((long)&(pSVar52->super_Matrix<double,_6,_1,_0,_6,_1>).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                          0x18) * (double)((DenseStorage<double,__1,__1,__1,_0> *)(pIVar46 + -1))->
                                          m_data +
                         *(double *)
                          ((long)&(pSVar52->super_Matrix<double,_6,_1,_0,_6,_1>).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8)
                         * (double)pIVar46[-3] +
                         *(double *)
                          ((long)&(pSVar52->super_Matrix<double,_6,_1,_0,_6,_1>).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                          0x20) * (double)*pIVar46 +
                         *(double *)
                          ((long)&(pSVar52->super_Matrix<double,_6,_1,_0,_6,_1>).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                          0x10) * (double)pIVar46[-2] +
                         *(double *)
                          &(pSVar52->super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                         ((plain_array<double,_6,_0,_16> *)(pIVar46 + -4))->array[0];
                    lVar48 = lVar48 + 1;
                    pIVar46 = pIVar46 + local_378.m_rows;
                    local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array[2] = (double)local_398.m_cols;
                  } while ((long)pDVar38 * (long)pDVar41 - lVar48 != 0);
                }
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [6] = (double)pDVar42->m_rows;
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [0] = (double)((long)(((Matrix<double,_6,_1,_0,_6,_1> *)&local_358->m_data)->
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                                     m_storage.m_data.array +
                              (long)(pDVar42->m_data +
                                    (long)local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                          .m_storage.m_data.array[6] * (long)dVar51));
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [4] = (double)local_3a1._1_8_;
                local_340.m_data = local_398.m_data;
                local_1f8.m_dst = (DstEvaluatorType *)&local_148;
                local_1f8.m_src = (SrcEvaluatorType *)&local_340;
                local_1f8.m_functor = (assign_op<double,_double> *)local_3a1;
                local_340.m_rows = (Index)pDVar41;
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [1] = (double)pDVar41;
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [3] = (double)pDVar42;
                local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [5] = dVar51;
                local_1f8.m_dstExpr = (DstXprType *)&local_318;
                local_148.m_data =
                     (double *)
                     local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0];
                local_148.m_cols =
                     (Index)local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[6];
                Eigen::internal::
                dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                ::run(&local_1f8);
                if (0 < local_398.m_rows) {
                  lVar48 = pDVar42->m_rows;
                  pdVar35 = pDVar42->m_data + (long)dVar51 + lVar48 * uVar32;
                  pDVar41 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                  pdVar40 = local_398.m_data;
                  do {
                    if (0 < local_398.m_cols) {
                      pDVar39 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                      pdVar49 = pdVar40;
                      do {
                        pdVar35[(long)pDVar39] = *pdVar49;
                        pDVar39 = (DenseStorage<double,__1,__1,__1,_0> *)
                                  ((long)&pDVar39->m_data + 1);
                        pdVar49 = pdVar49 + local_398.m_rows;
                      } while ((DenseStorage<double,__1,__1,__1,_0> *)local_398.m_cols != pDVar39);
                    }
                    pDVar41 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar41->m_data + 1);
                    pdVar40 = pdVar40 + 1;
                    pdVar35 = pdVar35 + lVar48;
                  } while (pDVar41 != (DenseStorage<double,__1,__1,__1,_0> *)local_398.m_rows);
                }
              }
              free(local_398.m_data);
            }
LAB_00171f9f:
            model = local_320;
            uVar33 = (local_320->lambda).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)pDVar43];
          }
          free(local_378.m_data);
          pDVar41 = local_380;
        }
        else {
          Math::SpatialRigidBodyInertia::operator*
                    ((model->Ic).
                     super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)pDVar43,
                     (model->S).
                     super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                     super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)pDVar43);
          pSVar52 = (model->S).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar35 = (double *)
                    ((long)&pSVar52[(long)pDVar43].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          pdVar40 = (double *)
                    ((long)&pSVar52[(long)pDVar43].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          pDVar42->m_data[pDVar42->m_rows * local_3a1._1_8_ + local_3a1._1_8_] =
               pdVar40[1] *
               local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [5] + pdVar35[1] *
                     local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[3] +
               *(double *)
                ((long)&pSVar52[(long)pDVar43].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
               local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [1] + *pdVar40 *
                     local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[4] +
                     *pdVar35 *
                     local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[2] +
                     *(double *)
                      &pSVar52[(long)pDVar43].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                     local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0];
          uVar33 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pDVar43];
          while (local_380 = pDVar41, uVar33 != 0) {
            Math::SpatialTransform::applyTranspose
                      ((model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)pDVar43,
                       (SpatialVector *)&local_318);
            local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
                 local_1d8[0];
            local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] =
                 local_1d8[1];
            local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
                 (double)local_1f8.m_functor;
            local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
                 (double)local_1f8.m_dstExpr;
            local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
                 (double)local_1f8.m_dst;
            local_318.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
                 (double)local_1f8.m_src;
            pJVar7 = (model->mJoints).
                     super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pDVar43 = (DenseStorage<double,__1,__1,__1,_0> *)
                      (ulong)(model->lambda).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[(long)pDVar43];
            uVar34 = (ulong)pJVar7[(long)pDVar43].q_index;
            if (pJVar7[(long)pDVar43].mJointType == JointTypeCustom) {
              pCVar8 = (model->mCustomJoints).
                       super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [pJVar7[(long)pDVar43].custom_joint_index];
              uVar50 = (ulong)*(uint *)(pCVar8 + 8);
              local_148.m_rows = (Index)(pCVar8 + 0x70);
              local_148.m_data = (double *)&local_318;
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
              PlainObjectBase<Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_1f8,
                         (DenseBase<Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
                          *)&local_148);
              pdVar35 = pDVar42->m_data;
              lVar48 = pDVar42->m_rows;
              if (uVar50 == 0) {
                pdVar35 = pdVar35 + uVar34 + lVar48 * local_3a1._1_8_;
                if (((ulong)pdVar35 & 7) == 0) goto LAB_00170aac;
              }
              else {
                pdVar40 = pdVar35 + local_3a1._1_8_ + uVar34 * lVar48;
                uVar47 = 0;
                do {
                  *pdVar40 = (((Matrix<double,_6,_1,_0,_6,_1> *)
                              &(local_1f8.m_dst)->
                               super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                              )->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                             m_storage.m_data.array[uVar47];
                  uVar47 = uVar47 + 1;
                  pdVar40 = pdVar40 + lVar48;
                } while (uVar50 != uVar47);
                pdVar35 = pdVar35 + uVar34 + lVar48 * local_3a1._1_8_;
                if (((ulong)pdVar35 & 7) == 0) {
LAB_00170aac:
                  uVar34 = (ulong)((uint)((ulong)pdVar35 >> 3) & 1);
                  if (uVar50 <= uVar34) {
                    uVar34 = uVar50;
                  }
                  if (uVar34 != 0) {
                    *pdVar35 = (((Matrix<double,_6,_1,_0,_6,_1> *)
                                &(local_1f8.m_dst)->
                                 super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                                )->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                               m_storage.m_data.array[0];
                  }
                  uVar44 = uVar50 - uVar34 & 0xfffffffffffffffe;
                  uVar47 = uVar44 | uVar34;
                  if (0 < (long)uVar44) {
                    do {
                      pdVar40 = (((Matrix<double,_6,_1,_0,_6,_1> *)
                                 &(local_1f8.m_dst)->
                                  super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                                 )->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                                m_storage.m_data.array + uVar34;
                      dVar51 = pdVar40[1];
                      pdVar35[uVar34] = *pdVar40;
                      (pdVar35 + uVar34)[1] = dVar51;
                      uVar34 = uVar34 + 2;
                    } while ((long)uVar34 < (long)uVar47);
                  }
                  for (; (long)uVar47 < (long)uVar50; uVar47 = uVar47 + 1) {
                    pdVar35[uVar47] =
                         (((Matrix<double,_6,_1,_0,_6,_1> *)
                          &(local_1f8.m_dst)->
                           super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                          )->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage
                         .m_data.array[uVar47];
                  }
                }
                else if (uVar50 != 0) {
                  uVar34 = 0;
                  do {
                    pdVar35[uVar34] =
                         (((Matrix<double,_6,_1,_0,_6,_1> *)
                          &(local_1f8.m_dst)->
                           super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                          )->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage
                         .m_data.array[uVar34];
                    uVar34 = uVar34 + 1;
                  } while (uVar50 != uVar34);
                }
              }
              free(local_1f8.m_dst);
            }
            else if (pJVar7[(long)pDVar43].mDoFCount == 3) {
              local_148.m_rows =
                   (Index)((model->multdof3_S).
                           super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                           .
                           super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)pDVar43);
              local_148.m_data = (double *)&local_318;
              Vector3_t::
              Vector3_t<Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>>,Eigen::Matrix<double,6,3,0,6,3>,0>const>>
                        ((Vector3_t *)&local_1f8,
                         (MatrixBase<Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>_>
                          *)&local_148);
              pdVar35 = pDVar42->m_data;
              lVar48 = pDVar42->m_rows;
              lVar45 = lVar48 * uVar34;
              pdVar35[local_3a1._1_8_ + lVar45] = (double)local_1f8.m_dst;
              pdVar35[local_3a1._1_8_ + lVar45 + lVar48] = (double)local_1f8.m_src;
              pdVar35[local_3a1._1_8_ + lVar45 + lVar48 * 2] = (double)local_1f8.m_functor;
              pdVar35[uVar34 + lVar48 * local_3a1._1_8_] = (double)local_1f8.m_dst;
              (pdVar35 + uVar34 + lVar48 * local_3a1._1_8_)[1] = (double)local_1f8.m_src;
              pdVar35[uVar34 + lVar48 * local_3a1._1_8_ + 2] = (double)local_1f8.m_functor;
            }
            else if (pJVar7[(long)pDVar43].mDoFCount == 1) {
              pSVar52 = (model->S).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pdVar35 = (double *)
                        ((long)&pSVar52[(long)pDVar43].super_Matrix<double,_6,_1,_0,_6,_1>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10)
              ;
              pdVar40 = (double *)
                        ((long)&pSVar52[(long)pDVar43].super_Matrix<double,_6,_1,_0,_6,_1>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20)
              ;
              dVar51 = local_1d8[1] * pdVar40[1] + (double)local_1f8.m_dstExpr * pdVar35[1] +
                       (double)local_1f8.m_src *
                       *(double *)
                        ((long)&pSVar52[(long)pDVar43].super_Matrix<double,_6,_1,_0,_6,_1>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                       local_1d8[0] * *pdVar40 + (double)local_1f8.m_functor * *pdVar35 +
                       (double)local_1f8.m_dst *
                       *(double *)
                        &pSVar52[(long)pDVar43].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
              pdVar35 = pDVar42->m_data;
              lVar48 = pDVar42->m_rows;
              pdVar35[uVar34 * lVar48 + local_3a1._1_8_] = dVar51;
              pdVar35[lVar48 * local_3a1._1_8_ + uVar34] = dVar51;
            }
            pDVar41 = local_380;
            uVar33 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)pDVar43];
          }
        }
      }
      else if (JVar4 == JointTypeCustom) goto LAB_001716fd;
      pDVar43 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar41[-1].m_cols + 7);
      adStack_158[1] = (double)((long)adStack_158[1] + -0x90);
    } while ((int)pDVar43 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI void CompositeRigidBodyAlgorithm (
    Model& model,
    const VectorNd &Q,
    MatrixNd &H,
    bool update_kinematics) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  assert (H.rows() == model.dof_count && H.cols() == model.dof_count);

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    if (update_kinematics) {
      jcalc_X_lambda_S (model, i, Q);
    }
    model.Ic[i] = model.I[i];
  }

  for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
    if (model.lambda[i] != 0) {
      model.Ic[model.lambda[i]] = model.Ic[model.lambda[i]] + model.X_lambda[i].applyTranspose(model.Ic[i]);
    }

    unsigned int dof_index_i = model.mJoints[i].q_index;

    if (model.mJoints[i].mDoFCount == 1 
        && model.mJoints[i].mJointType != JointTypeCustom) {

      SpatialVector F             = model.Ic[i] * model.S[i];
      H(dof_index_i, dof_index_i) = model.S[i].dot(F);

      unsigned int j = i;
      unsigned int dof_index_j = dof_index_i;

      while (model.lambda[j] != 0) {
        F = model.X_lambda[j].applyTranspose(F);
        j = model.lambda[j];
        dof_index_j = model.mJoints[j].q_index;

        if(model.mJoints[j].mJointType != JointTypeCustom) {
          if (model.mJoints[j].mDoFCount == 1) {
            H(dof_index_i,dof_index_j) = F.dot(model.S[j]);
            H(dof_index_j,dof_index_i) = H(dof_index_i,dof_index_j);
          } else if (model.mJoints[j].mDoFCount == 3) {
            Vector3d H_temp2 = 
              (F.transpose() * model.multdof3_S[j]).transpose();
            LOG << F.transpose() << std::endl 
              << model.multdof3_S[j] << std::endl;
            LOG << H_temp2.transpose() << std::endl;

            H.block<1,3>(dof_index_i,dof_index_j) = H_temp2.transpose();
            H.block<3,1>(dof_index_j,dof_index_i) = H_temp2;
          }
        } else if (model.mJoints[j].mJointType == JointTypeCustom){        
          unsigned int k      = model.mJoints[j].custom_joint_index;
          unsigned int dof    = model.mCustomJoints[k]->mDoFCount;
          VectorNd H_temp2    =
            (F.transpose() * model.mCustomJoints[k]->S).transpose();

          LOG << F.transpose()
            << std::endl
            << model.mCustomJoints[j]->S << std::endl;

          LOG << H_temp2.transpose() << std::endl;

          H.block(dof_index_i,dof_index_j,1,dof) = H_temp2.transpose();
          H.block(dof_index_j,dof_index_i,dof,1) = H_temp2;
        }
      }
    } else if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Matrix63 F_63 = model.Ic[i].toMatrix() * model.multdof3_S[i];
      H.block<3,3>(dof_index_i, dof_index_i) = model.multdof3_S[i].transpose() * F_63;

      unsigned int j = i;
      unsigned int dof_index_j = dof_index_i;

      while (model.lambda[j] != 0) {
        F_63 = model.X_lambda[j].toMatrixTranspose() * (F_63);
        j = model.lambda[j];
        dof_index_j = model.mJoints[j].q_index;

        if(model.mJoints[j].mJointType != JointTypeCustom){
          if (model.mJoints[j].mDoFCount == 1) {
            Vector3d H_temp2 = F_63.transpose() * (model.S[j]);

            H.block<3,1>(dof_index_i,dof_index_j) = H_temp2;
            H.block<1,3>(dof_index_j,dof_index_i) = H_temp2.transpose();
          } else if (model.mJoints[j].mDoFCount == 3) {
            Matrix3d H_temp2 = F_63.transpose() * (model.multdof3_S[j]);

            H.block<3,3>(dof_index_i,dof_index_j) = H_temp2;
            H.block<3,3>(dof_index_j,dof_index_i) = H_temp2.transpose();
          }
        } else if (model.mJoints[j].mJointType == JointTypeCustom){
          unsigned int k = model.mJoints[j].custom_joint_index;
          unsigned int dof = model.mCustomJoints[k]->mDoFCount;

          MatrixNd H_temp2 = F_63.transpose() * (model.mCustomJoints[k]->S);

          H.block(dof_index_i,dof_index_j,3,dof) = H_temp2;
          H.block(dof_index_j,dof_index_i,dof,3) = H_temp2.transpose();
        }
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {      
      unsigned int kI = model.mJoints[i].custom_joint_index;
      unsigned int dofI = model.mCustomJoints[kI]->mDoFCount;

      MatrixNd F_Nd = model.Ic[i].toMatrix()
        * model.mCustomJoints[kI]->S;

      H.block(dof_index_i, dof_index_i,dofI,dofI)
        = model.mCustomJoints[kI]->S.transpose() * F_Nd;

      unsigned int j = i;
      unsigned int dof_index_j = dof_index_i;

      while (model.lambda[j] != 0) {
        F_Nd = model.X_lambda[j].toMatrixTranspose() * (F_Nd);
        j = model.lambda[j];
        dof_index_j = model.mJoints[j].q_index;

        if(model.mJoints[j].mJointType != JointTypeCustom){
          if (model.mJoints[j].mDoFCount == 1) {
            MatrixNd H_temp2 = F_Nd.transpose() * (model.S[j]);
            H.block(   dof_index_i,  dof_index_j,
                H_temp2.rows(),H_temp2.cols()) = H_temp2;
            H.block(dof_index_j,dof_index_i,
                H_temp2.cols(),H_temp2.rows()) = H_temp2.transpose();
          } else if (model.mJoints[j].mDoFCount == 3) {
            MatrixNd H_temp2 = F_Nd.transpose() * (model.multdof3_S[j]);
            H.block(dof_index_i,   dof_index_j,
                H_temp2.rows(),H_temp2.cols()) = H_temp2;
            H.block(dof_index_j,   dof_index_i,
                H_temp2.cols(),H_temp2.rows()) = H_temp2.transpose();
          }
        } else if (model.mJoints[j].mJointType == JointTypeCustom){
          unsigned int k   = model.mJoints[j].custom_joint_index;
          unsigned int dof = model.mCustomJoints[k]->mDoFCount;

          MatrixNd H_temp2 = F_Nd.transpose() * (model.mCustomJoints[k]->S);

          H.block(dof_index_i,dof_index_j,3,dof) = H_temp2;
          H.block(dof_index_j,dof_index_i,dof,3) = H_temp2.transpose();
        }
      }
    }
  }
}